

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O2

ze_result_t
driver::zesVFManagementGetVFPropertiesExp
          (zes_vf_handle_t hVFhandle,zes_vf_exp_properties_t *pProperties)

{
  ze_result_t zVar1;
  
  if (DAT_0010dde0 != (code *)0x0) {
    zVar1 = (*DAT_0010dde0)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesVFManagementGetVFPropertiesExp(
        zes_vf_handle_t hVFhandle,                      ///< [in] Sysman handle for the VF component.
        zes_vf_exp_properties_t* pProperties            ///< [in,out] Will contain VF properties.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetVFPropertiesExp = context.zesDdiTable.VFManagementExp.pfnGetVFPropertiesExp;
        if( nullptr != pfnGetVFPropertiesExp )
        {
            result = pfnGetVFPropertiesExp( hVFhandle, pProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }